

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O3

char * __thiscall Am_Load_Save_Context::To_String(Am_Load_Save_Context *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->data != (Am_Load_Save_Context_Data *)0x0) {
    iVar1 = (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[1])()
    ;
    return (char *)CONCAT44(extraout_var,iVar1);
  }
  return (char *)0x0;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}